

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_paramSwitch_e useRowMatchFinder,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  rawSeq *prVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  BYTE *pBVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  ZSTD_blockCompressor UNRECOVERED_JUMPTABLE;
  size_t sVar11;
  BYTE *pBVar12;
  ZSTD_dictMode_e dictMode;
  uint uVar13;
  uint uVar14;
  undefined8 *puVar15;
  undefined8 *puVar16;
  undefined8 *puVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar21;
  ulong uVar22;
  U32 UVar20;
  
  dictMode = ZSTD_extDict;
  if ((ms->window).dictLimit <= (ms->window).lowLimit) {
    if (ms->dictMatchState == (ZSTD_matchState_t *)0x0) {
      dictMode = ZSTD_noDict;
    }
    else {
      dictMode = ZSTD_dedicatedDictSearch - (ms->dictMatchState->dedicatedDictSearch == 0);
    }
  }
  uVar10 = (ms->cParams).minMatch;
  UNRECOVERED_JUMPTABLE =
       ZSTD_selectBlockCompressor((ms->cParams).strategy,useRowMatchFinder,dictMode);
  if (ZSTD_btlazy2 < (ms->cParams).strategy) {
    ms->ldmSeqStore = rawSeqStore;
    sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,srcSize);
    ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore,srcSize);
    return sVar11;
  }
  if (rawSeqStore->size < rawSeqStore->pos) {
    __assert_fail("rawSeqStore->pos <= rawSeqStore->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ad,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  if (rawSeqStore->capacity < rawSeqStore->size) {
    __assert_fail("rawSeqStore->size <= rawSeqStore->capacity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                  ,0x2ae,
                  "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                 );
  }
  puVar17 = (undefined8 *)(srcSize + (long)src);
  puVar1 = puVar17 + -4;
  do {
    uVar21 = rawSeqStore->pos;
    if ((rawSeqStore->size <= uVar21) || (puVar17 <= src)) break;
    prVar2 = rawSeqStore->seq + uVar21;
    uVar22._0_4_ = prVar2->offset;
    uVar22._4_4_ = prVar2->litLength;
    if ((undefined4)uVar22 == 0) {
      __assert_fail("sequence.offset > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                    ,0x26f,"rawSeq maybeSplitSequence(rawSeqStore_t *, const U32, const U32)");
    }
    uVar19 = uVar22 >> 0x20;
    uVar14 = rawSeqStore->seq[uVar21].matchLength;
    uVar9 = (uint)((long)puVar17 - (long)src);
    if (uVar9 < uVar14 + uVar22._4_4_) {
      uVar21 = uVar22;
      if (uVar9 - uVar22._4_4_ < uVar10) {
        uVar21 = 0;
      }
      uVar13 = uVar9 - uVar22._4_4_;
      if (uVar9 < (uint)uVar22._4_4_ || uVar9 - uVar22._4_4_ == 0) {
        uVar21 = 0;
        uVar13 = uVar14;
      }
      uVar14 = uVar13;
      ZSTD_ldm_skipSequences(rawSeqStore,(long)puVar17 - (long)src & 0xffffffff,uVar10);
      uVar22 = uVar21;
    }
    else {
      rawSeqStore->pos = uVar21 + 1;
    }
    UVar20 = (U32)uVar22;
    if (UVar20 != 0) {
      puVar3 = (undefined8 *)((long)src + uVar19);
      puVar4 = (undefined8 *)((ulong)uVar14 + (long)puVar3);
      if (puVar17 < puVar4) {
        __assert_fail("ip + sequence.litLength + sequence.matchLength <= iend",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_ldm.c"
                      ,0x2b9,
                      "size_t ZSTD_ldm_blockCompress(rawSeqStore_t *, ZSTD_matchState_t *, seqStore_t *, U32 *, ZSTD_paramSwitch_e, const void *, size_t)"
                     );
      }
      uVar9 = (int)src - *(int *)&(ms->window).base;
      if (ms->nextToUpdate + 0x400 < uVar9) {
        uVar13 = (uVar9 - ms->nextToUpdate) - 0x400;
        if (0x1ff < uVar13) {
          uVar13 = 0x200;
        }
        ms->nextToUpdate = uVar9 - uVar13;
      }
      ZSTD_ldm_fillFastTables(ms,src);
      sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,uVar19);
      *(undefined8 *)(rep + 1) = *(undefined8 *)rep;
      *rep = UVar20;
      if (seqStore->maxNbSeq <=
          (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < seqStore->maxNbLit) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar6 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar6 + sVar11) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (puVar17 < puVar3) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      puVar15 = (undefined8 *)((long)puVar3 - sVar11);
      if (puVar1 < puVar3) {
        pBVar12 = pBVar6;
        puVar16 = puVar15;
        if (puVar15 <= puVar1) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar6 + (-0x10 - (long)puVar15)) {
LAB_00206df2:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          pBVar12 = pBVar6 + ((long)puVar1 - (long)puVar15);
          uVar8 = puVar15[1];
          *(undefined8 *)pBVar6 = *puVar15;
          *(undefined8 *)(pBVar6 + 8) = uVar8;
          puVar16 = puVar1;
          if (0x10 < (long)puVar1 - (long)puVar15) {
            lVar18 = 0x10;
            do {
              puVar15 = (undefined8 *)((long)src + lVar18 + (uVar19 - sVar11));
              uVar8 = puVar15[1];
              pBVar5 = pBVar6 + lVar18;
              *(undefined8 *)pBVar5 = *puVar15;
              *(undefined8 *)(pBVar5 + 8) = uVar8;
              puVar15 = (undefined8 *)((long)src + lVar18 + (uVar19 - sVar11) + 0x10);
              uVar8 = puVar15[1];
              *(undefined8 *)(pBVar5 + 0x10) = *puVar15;
              *(undefined8 *)(pBVar5 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar5 + 0x20 < pBVar12);
          }
        }
        if (puVar16 < puVar3) {
          lVar18 = 0;
          do {
            pBVar12[lVar18] = *(BYTE *)((long)puVar16 + lVar18);
            lVar18 = lVar18 + 1;
          } while ((long)puVar3 - (long)puVar16 != lVar18);
        }
      }
      else {
        uVar8 = puVar15[1];
        *(undefined8 *)pBVar6 = *puVar15;
        *(undefined8 *)(pBVar6 + 8) = uVar8;
        if (0x10 < sVar11) {
          pBVar6 = seqStore->lit;
          if ((BYTE *)0xffffffffffffffe0 < pBVar6 + 0x10 + (-0x10 - (long)(puVar15 + 2)))
          goto LAB_00206df2;
          uVar8 = puVar15[3];
          *(undefined8 *)(pBVar6 + 0x10) = puVar15[2];
          *(undefined8 *)(pBVar6 + 0x18) = uVar8;
          if (0x20 < (long)sVar11) {
            lVar18 = 0;
            do {
              puVar3 = (undefined8 *)((long)src + lVar18 + (uVar19 - sVar11) + 0x20);
              uVar8 = puVar3[1];
              pBVar12 = pBVar6 + lVar18 + 0x20;
              *(undefined8 *)pBVar12 = *puVar3;
              *(undefined8 *)(pBVar12 + 8) = uVar8;
              puVar3 = (undefined8 *)((long)src + lVar18 + (uVar19 - sVar11) + 0x30);
              uVar8 = puVar3[1];
              *(undefined8 *)(pBVar12 + 0x10) = *puVar3;
              *(undefined8 *)(pBVar12 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar12 + 0x20 < pBVar6 + sVar11);
          }
        }
      }
      seqStore->lit = seqStore->lit + sVar11;
      if (0xffff < sVar11) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
      psVar7 = seqStore->sequences;
      psVar7->litLength = (U16)sVar11;
      psVar7->offBase = UVar20 + 3;
      if (uVar14 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar21 = (ulong)uVar14 - 3;
      if (0xffff < uVar21) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar7 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar7->mlBase = (U16)uVar21;
      seqStore->sequences = psVar7 + 1;
      src = puVar4;
    }
  } while (UVar20 != 0);
  uVar10 = (int)src - *(int *)&(ms->window).base;
  if (ms->nextToUpdate + 0x400 < uVar10) {
    uVar14 = (uVar10 - ms->nextToUpdate) - 0x400;
    if (0x1ff < uVar14) {
      uVar14 = 0x200;
    }
    ms->nextToUpdate = uVar10 - uVar14;
  }
  ZSTD_ldm_fillFastTables(ms,src);
  sVar11 = (*UNRECOVERED_JUMPTABLE)(ms,seqStore,rep,src,(long)puVar17 - (long)src);
  return sVar11;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_paramSwitch_e useRowMatchFinder,
    void const* src, size_t srcSize)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    unsigned const minMatch = cParams->minMatch;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, useRowMatchFinder, ZSTD_matchState_dictMode(ms));
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    DEBUGLOG(5, "ZSTD_ldm_blockCompress: srcSize=%zu", srcSize);
    /* If using opt parser, use LDMs only as candidates rather than always accepting them */
    if (cParams->strategy >= ZSTD_btopt) {
        size_t lastLLSize;
        ms->ldmSeqStore = rawSeqStore;
        lastLLSize = blockCompressor(ms, seqStore, rep, src, srcSize);
        ZSTD_ldm_skipRawSeqStoreBytes(rawSeqStore, srcSize);
        return lastLLSize;
    }

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the literals */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, ip);
        /* Run the block compressor */
        DEBUGLOG(5, "pos %u : calling block compressor on segment of size %u", (unsigned)(ip-istart), sequence.litLength);
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, ip, sequence.litLength);
            ip += sequence.litLength;
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength, iend,
                          OFFSET_TO_OFFBASE(sequence.offset),
                          sequence.matchLength);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, ip);
    /* Compress the last literals */
    return blockCompressor(ms, seqStore, rep, ip, iend - ip);
}